

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t driver::zetMetricDestroyExp(zet_metric_handle_t hMetric)

{
  ze_result_t zVar1;
  
  if (DAT_0010d840 != (code *)0x0) {
    zVar1 = (*DAT_0010d840)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDestroyExp(
        zet_metric_handle_t hMetric                     ///< [in] Handle of the metric to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zetDdiTable.MetricExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hMetric );
        }
        else
        {
            // generic implementation
        }

        return result;
    }